

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv+scc.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  flvtag_avcpackettype_t fVar2;
  size_t sVar3;
  double dVar4;
  double timestamp;
  int has_video;
  int has_audio;
  FILE *out;
  utf8_char_t *scc_data;
  utf8_char_t *scc_data_ptr;
  FILE *flv;
  size_t scc_size;
  scc_t *scc;
  flvtag_t tag;
  char **argv_local;
  int argc_local;
  
  scc_size = 0;
  flv = (FILE *)0x0;
  tag.aloc = (size_t)argv;
  if (argc < 4) {
    fprintf(_stderr,"Usage: %s input.flv input.scc output.flv\nuse \'-\' for stdin or stdout\n",
            *argv);
    exit(1);
  }
  scc_data_ptr = (utf8_char_t *)flv_open_read(argv[1]);
  out = (FILE *)utf8_load_text_file(scc_data_ptr,(size_t *)scc_data);
  scc_data = (utf8_char_t *)out;
  _has_video = flv_open_write(*(char **)(tag.aloc + 0x18));
  if (scc_data_ptr == (utf8_char_t *)0x0) {
    fprintf(_stderr,"Falule to open input flv \'%s\'\n",*(undefined8 *)(tag.aloc + 8));
    exit(1);
  }
  if (out == (FILE *)0x0) {
    fprintf(_stderr,"Falule to open input scc \'%s\'\n",*(undefined8 *)(tag.aloc + 0x10));
    exit(1);
  }
  if (_has_video == (FILE *)0x0) {
    fprintf(_stderr,"Falule to open output flv \'%s\'\n",*(undefined8 *)(tag.aloc + 0x18));
    exit(1);
  }
  flvtag_init((flvtag_t *)&scc);
  iVar1 = flv_read_header((FILE *)scc_data_ptr,(int *)((long)&timestamp + 4),(int *)&timestamp);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s is not an flv file\n",*(undefined8 *)(tag.aloc + 8));
    argv_local._4_4_ = 1;
  }
  else {
    flv_write_header(_has_video,timestamp._4_4_,timestamp._0_4_);
    sVar3 = scc_to_608((scc_t **)scc,(utf8_char_t *)scc_size);
    out = (FILE *)((long)&out->_flags + sVar3);
    while( true ) {
      iVar1 = flv_read_tag((FILE *)scc_data_ptr,(flvtag_t *)&scc);
      if (iVar1 == 0) break;
      dVar4 = flvtag_pts_seconds((flvtag_t *)&scc);
      if (((scc_size != 0) && (*(int *)(scc_size + 0xc) != 0)) && (*(double *)scc_size < dVar4)) {
        fVar2 = flvtag_avcpackettype((flvtag_t *)&scc);
        if (fVar2 == flvtag_avcpackettype_nalu) {
          flvtag_addcaption_scc((flvtag_t *)&scc,(scc_t *)scc_size);
          sVar3 = scc_to_608((scc_t **)scc,(utf8_char_t *)scc_size);
          out = (FILE *)((long)&out->_flags + sVar3);
        }
      }
      flv_write_tag(_has_video,(flvtag_t *)&scc);
    }
    free(scc_data);
    flvtag_free((flvtag_t *)&scc);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    flvtag_t tag;
    scc_t* scc = NULL;
    size_t scc_size = 0;

    if (4 > argc) {
        fprintf(stderr, "Usage: %s input.flv input.scc output.flv\nuse '-' for stdin or stdout\n", argv[0]);
        exit(EXIT_FAILURE);
    }

    FILE* flv = flv_open_read(argv[1]);
    utf8_char_t* scc_data_ptr = utf8_load_text_file(argv[2], &scc_size);
    utf8_char_t* scc_data = scc_data_ptr;
    FILE* out = flv_open_write(argv[3]);

    if (!flv) {
        fprintf(stderr, "Falule to open input flv '%s'\n", argv[1]);
        exit(EXIT_FAILURE);
    }

    if (!scc_data) {
        fprintf(stderr, "Falule to open input scc '%s'\n", argv[2]);
        exit(EXIT_FAILURE);
    }

    if (!out) {
        fprintf(stderr, "Falule to open output flv '%s'\n", argv[3]);
        exit(EXIT_FAILURE);
    }

    int has_audio, has_video;
    flvtag_init(&tag);

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "%s is not an flv file\n", argv[1]);
        return EXIT_FAILURE;
    }

    flv_write_header(out, has_audio, has_video);

    // read the first scc
    scc_data += scc_to_608(&scc, scc_data);

    while (flv_read_tag(flv, &tag)) {
        double timestamp = flvtag_pts_seconds(&tag);

        if (scc && scc->cc_size && scc->timestamp < timestamp && flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag)) {
            flvtag_addcaption_scc(&tag, scc);
            scc_data += scc_to_608(&scc, scc_data);
        }

        flv_write_tag(out, &tag);
    }

    free(scc_data_ptr);
    flvtag_free(&tag);
    return EXIT_SUCCESS;
}